

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::Render(void)

{
  ImDrawDataBuilder *out_list;
  uint uVar1;
  int iVar2;
  ImGuiWindow *pIVar3;
  ImTextureID texture_id;
  ImDrawList *pIVar4;
  _func_void_ImDrawData_ptr *p_Var5;
  ImGuiContext *pIVar6;
  bool bVar7;
  ulong uVar8;
  ImDrawList **ppIVar9;
  long lVar10;
  int iVar11;
  int iVar12;
  ulong uVar13;
  ImGuiWindow *window;
  float fVar14;
  ImVec2 size;
  ImVec2 offset;
  ImVec2 uv [4];
  ImVec2 pos;
  ImVec2 local_a0;
  ImVec2 local_98;
  ImVec2 local_90;
  ImVec2 local_88;
  ImVec2 IStack_80;
  ImVec2 local_78;
  ImVec2 IStack_70;
  undefined1 local_68 [16];
  ImVec2 local_50;
  undefined1 local_48 [16];
  ImVec2 local_38;
  
  pIVar6 = GImGui;
  if (GImGui->Initialized == false) {
    __assert_fail("g.Initialized",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sreiter[P]lumeview/deps/imgui/imgui.cpp"
                  ,0x100e,"void ImGui::Render()");
  }
  if (GImGui->FrameCountEnded != GImGui->FrameCount) {
    EndFrame();
  }
  pIVar6->FrameCountRendered = pIVar6->FrameCount;
  (pIVar6->IO).MetricsActiveWindows = 0;
  (pIVar6->IO).MetricsRenderVertices = 0;
  (pIVar6->IO).MetricsRenderIndices = 0;
  out_list = &pIVar6->DrawDataBuilder;
  ImDrawDataBuilder::Clear(out_list);
  pIVar3 = pIVar6->NavWindowingTarget;
  window = (ImGuiWindow *)0x0;
  if ((pIVar3 != (ImGuiWindow *)0x0) && ((pIVar3->Flags & 0x2000) == 0)) {
    window = pIVar3;
  }
  uVar1 = (pIVar6->Windows).Size;
  uVar8 = (ulong)uVar1;
  if (uVar1 != 0) {
    uVar13 = 0;
    do {
      if ((long)(int)uVar8 <= (long)uVar13) {
        __assert_fail("i < Size",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sreiter[P]lumeview/deps/imgui/imgui.h"
                      ,0x49a,
                      "value_type &ImVector<ImGuiWindow *>::operator[](int) [T = ImGuiWindow *]");
      }
      pIVar3 = (pIVar6->Windows).Data[uVar13];
      if ((((pIVar3->Active == true) && (pIVar3->HiddenFrames == 0)) && (pIVar3 != window)) &&
         ((pIVar3->Flags & 0x1000000U) == 0)) {
        AddWindowToDrawDataSelectLayer(pIVar3);
      }
      uVar13 = uVar13 + 1;
      uVar8 = (ulong)(uint)(pIVar6->Windows).Size;
    } while (uVar13 != uVar8);
  }
  if (((window != (ImGuiWindow *)0x0) && (window->Active == true)) && (window->HiddenFrames == 0)) {
    AddWindowToDrawDataSelectLayer(window);
  }
  ImDrawDataBuilder::FlattenIntoSingleLayer(out_list);
  local_90.x = 0.0;
  local_90.y = 0.0;
  local_a0.x = 0.0;
  local_a0.y = 0.0;
  local_78.x = 0.0;
  local_78.y = 0.0;
  IStack_70.x = 0.0;
  IStack_70.y = 0.0;
  local_88.x = 0.0;
  local_88.y = 0.0;
  IStack_80.x = 0.0;
  IStack_80.y = 0.0;
  if ((pIVar6->IO).MouseDrawCursor == true) {
    bVar7 = ImFontAtlas::GetMouseCursorTexData
                      ((pIVar6->IO).Fonts,pIVar6->MouseCursor,&local_90,&local_a0,&local_88,
                       &local_78);
    if (bVar7) {
      local_38.y = (pIVar6->IO).MousePos.y - local_90.y;
      local_38.x = (pIVar6->IO).MousePos.x - local_90.x;
      texture_id = ((pIVar6->IO).Fonts)->TexID;
      local_68 = ZEXT416((uint)(pIVar6->Style).MouseCursorScale);
      pIVar4 = &pIVar6->OverlayDrawList;
      ImDrawList::PushTextureID(pIVar4,texture_id);
      local_48 = ZEXT416((uint)((float)local_68._0_4_ * 0.0));
      fVar14 = local_38.y + (float)local_68._0_4_ * 0.0;
      local_98.y = fVar14;
      local_98.x = local_38.x + (float)local_68._0_4_;
      local_50.y = local_a0.y * (float)local_68._0_4_ + fVar14;
      local_50.x = local_a0.x * (float)local_68._0_4_ + local_38.x + (float)local_68._0_4_;
      ImDrawList::AddImage(pIVar4,texture_id,&local_98,&local_50,&local_78,&IStack_70,0x30000000);
      fVar14 = (float)local_68._0_4_ + (float)local_68._0_4_ + local_38.x;
      local_98.y = (float)local_48._0_4_ + local_38.y;
      local_98.x = fVar14;
      local_50.y = local_a0.y * (float)local_68._0_4_ + (float)local_48._0_4_ + local_38.y;
      local_50.x = local_a0.x * (float)local_68._0_4_ + fVar14;
      ImDrawList::AddImage(pIVar4,texture_id,&local_98,&local_50,&local_78,&IStack_70,0x30000000);
      local_98.y = local_a0.y * (float)local_68._0_4_ + local_38.y;
      local_98.x = local_a0.x * (float)local_68._0_4_ + local_38.x;
      ImDrawList::AddImage(pIVar4,texture_id,&local_38,&local_98,&local_78,&IStack_70,0xff000000);
      local_98.y = (float)local_68._0_4_ * local_a0.y + local_38.y;
      local_98.x = local_a0.x * (float)local_68._0_4_ + local_38.x;
      ImDrawList::AddImage(pIVar4,texture_id,&local_38,&local_98,&local_88,&IStack_80,0xffffffff);
      ImDrawList::PopTextureID(pIVar4);
    }
  }
  if ((pIVar6->OverlayDrawList).VtxBuffer.Size != 0) {
    AddDrawListToDrawData(out_list->Layers,&pIVar6->OverlayDrawList);
  }
  (pIVar6->DrawData).Valid = true;
  iVar2 = (pIVar6->DrawDataBuilder).Layers[0].Size;
  if ((long)iVar2 < 1) {
    ppIVar9 = (ImDrawList **)0x0;
  }
  else {
    ppIVar9 = (pIVar6->DrawDataBuilder).Layers[0].Data;
  }
  (pIVar6->DrawData).CmdLists = ppIVar9;
  (pIVar6->DrawData).CmdListsCount = iVar2;
  (pIVar6->DrawData).TotalIdxCount = 0;
  (pIVar6->DrawData).TotalVtxCount = 0;
  if (0 < iVar2) {
    lVar10 = 0;
    iVar11 = 0;
    iVar12 = 0;
    do {
      pIVar4 = (pIVar6->DrawDataBuilder).Layers[0].Data[lVar10];
      iVar12 = iVar12 + (pIVar4->VtxBuffer).Size;
      iVar11 = iVar11 + (pIVar4->IdxBuffer).Size;
      lVar10 = lVar10 + 1;
    } while (iVar2 != lVar10);
    (pIVar6->DrawData).TotalVtxCount = iVar12;
    (pIVar6->DrawData).TotalIdxCount = iVar11;
  }
  uVar8._0_4_ = (pIVar6->DrawData).TotalIdxCount;
  uVar8._4_4_ = (pIVar6->DrawData).TotalVtxCount;
  uVar8 = uVar8 << 0x20 | uVar8 >> 0x20;
  (pIVar6->IO).MetricsRenderVertices = (int)uVar8;
  (pIVar6->IO).MetricsRenderIndices = (int)(uVar8 >> 0x20);
  if ((0 < (pIVar6->DrawData).CmdListsCount) &&
     (p_Var5 = (pIVar6->IO).RenderDrawListsFn, p_Var5 != (_func_void_ImDrawData_ptr *)0x0)) {
    (*p_Var5)(&pIVar6->DrawData);
  }
  return;
}

Assistant:

void ImGui::Render()
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(g.Initialized);   // Forgot to call ImGui::NewFrame()

    if (g.FrameCountEnded != g.FrameCount)
        ImGui::EndFrame();
    g.FrameCountRendered = g.FrameCount;

    // Gather windows to render
    g.IO.MetricsRenderVertices = g.IO.MetricsRenderIndices = g.IO.MetricsActiveWindows = 0;
    g.DrawDataBuilder.Clear();
    ImGuiWindow* window_to_render_front_most = (g.NavWindowingTarget && !(g.NavWindowingTarget->Flags & ImGuiWindowFlags_NoBringToFrontOnFocus)) ? g.NavWindowingTarget : NULL;
    for (int n = 0; n != g.Windows.Size; n++)
    {
        ImGuiWindow* window = g.Windows[n];
        if (window->Active && window->HiddenFrames == 0 && (window->Flags & ImGuiWindowFlags_ChildWindow) == 0 && window != window_to_render_front_most)
            AddWindowToDrawDataSelectLayer(window);
    }
    if (window_to_render_front_most && window_to_render_front_most->Active && window_to_render_front_most->HiddenFrames == 0) // NavWindowingTarget is always temporarily displayed as the front-most window
        AddWindowToDrawDataSelectLayer(window_to_render_front_most);
    g.DrawDataBuilder.FlattenIntoSingleLayer();

    // Draw software mouse cursor if requested
    ImVec2 offset, size, uv[4];
    if (g.IO.MouseDrawCursor && g.IO.Fonts->GetMouseCursorTexData(g.MouseCursor, &offset, &size, &uv[0], &uv[2]))
    {
        const ImVec2 pos = g.IO.MousePos - offset;
        const ImTextureID tex_id = g.IO.Fonts->TexID;
        const float sc = g.Style.MouseCursorScale;
        g.OverlayDrawList.PushTextureID(tex_id);
        g.OverlayDrawList.AddImage(tex_id, pos + ImVec2(1,0)*sc, pos+ImVec2(1,0)*sc + size*sc, uv[2], uv[3], IM_COL32(0,0,0,48));        // Shadow
        g.OverlayDrawList.AddImage(tex_id, pos + ImVec2(2,0)*sc, pos+ImVec2(2,0)*sc + size*sc, uv[2], uv[3], IM_COL32(0,0,0,48));        // Shadow
        g.OverlayDrawList.AddImage(tex_id, pos,                  pos + size*sc,                uv[2], uv[3], IM_COL32(0,0,0,255));       // Black border
        g.OverlayDrawList.AddImage(tex_id, pos,                  pos + size*sc,                uv[0], uv[1], IM_COL32(255,255,255,255)); // White fill
        g.OverlayDrawList.PopTextureID();
    }
    if (!g.OverlayDrawList.VtxBuffer.empty())
        AddDrawListToDrawData(&g.DrawDataBuilder.Layers[0], &g.OverlayDrawList);

    // Setup ImDrawData structure for end-user
    SetupDrawData(&g.DrawDataBuilder.Layers[0], &g.DrawData);
    g.IO.MetricsRenderVertices = g.DrawData.TotalVtxCount;
    g.IO.MetricsRenderIndices = g.DrawData.TotalIdxCount;

    // Render. If user hasn't set a callback then they may retrieve the draw data via GetDrawData()
#ifndef IMGUI_DISABLE_OBSOLETE_FUNCTIONS
    if (g.DrawData.CmdListsCount > 0 && g.IO.RenderDrawListsFn != NULL)
        g.IO.RenderDrawListsFn(&g.DrawData);
#endif
}